

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationEntry.h
# Opt level: O2

void __thiscall
cmDocumentationEntry::cmDocumentationEntry(cmDocumentationEntry *this,char *n,char *b)

{
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->Brief)._M_dataplus._M_p = (pointer)&(this->Brief).field_2;
  (this->Brief)._M_string_length = 0;
  (this->Brief).field_2._M_local_buf[0] = '\0';
  if (n != (char *)0x0) {
    std::__cxx11::string::assign((char *)this);
  }
  if (b != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->Brief);
  }
  return;
}

Assistant:

cmDocumentationEntry(const char* n, const char* b)
  {
    if (n) {
      this->Name = n;
    }
    if (b) {
      this->Brief = b;
    }
  }